

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int __thiscall geemuboi::core::CPU::jr_nz_r8(CPU *this)

{
  ushort uVar1;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int offset;
  CPU *this_local;
  
  if ((this->regs->f & 0x80) == 0) {
    uVar1 = this->regs->pc;
    iVar2 = (**this->mmu->_vptr_IMmu)
                      (this->mmu,(ulong)uVar1,in_RDX,CONCAT62((int6)((ulong)in_RCX >> 0x10),uVar1));
    this->regs->pc = this->regs->pc + (char)iVar2 + 1;
    this_local._4_4_ = 3;
  }
  else {
    this->regs->pc = this->regs->pc + 1;
    this_local._4_4_ = 2;
  }
  return this_local._4_4_;
}

Assistant:

int CPU::jr_nz_r8() {
    if (!(regs.f & ICpu::Z_FLAG)) {
        int offset = static_cast<int8_t>(mmu.read_byte(regs.pc)) + 2;
        regs.pc += offset - 1;
        return 3;
    } else {
        regs.pc += 1;
        return 2;
    }
}